

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,
          vector<mjs::string,_std::allocator<mjs::string>_> *v)

{
  char *pcVar1;
  wostream *pwVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  std::operator<<(os,"{");
  lVar4 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(v->super__Vector_base<mjs::string,_std::allocator<mjs::string>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<mjs::string,_std::allocator<mjs::string>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
    pcVar1 = "], ";
    if (uVar3 == 0) {
      pcVar1 = "\t";
    }
    pwVar2 = std::operator<<(os,pcVar1 + 1);
    mjs::operator<<(pwVar2,(string *)
                           ((long)&(((v->
                                     super__Vector_base<mjs::string,_std::allocator<mjs::string>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->
                                   super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.
                                   heap_ + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  pwVar2 = std::operator<<(os,"}");
  return pwVar2;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const std::vector<T>& v) {
    os << "{";
    for (size_t i = 0; i < v.size(); ++i) {
        os << (i ? ", " : "") << v[i];
    }
    return os << "}";
}